

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

int __thiscall QFSFileEngine::remove(QFSFileEngine *this,char *__filename)

{
  QAbstractFileEnginePrivate *pQVar1;
  bool bVar2;
  undefined7 extraout_var;
  long in_FS_OFFSET;
  QSystemError error;
  QString local_40;
  QSystemError local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  local_28.errorCode = 0;
  local_28.errorScope = NoError;
  bVar2 = QFileSystemEngine::removeFile((QFileSystemEntry *)(pQVar1 + 1),&local_28);
  if (bVar2) {
    *(undefined4 *)&pQVar1[2].errorString.d.d = 0;
  }
  else {
    QSystemError::string(&local_40,local_28.errorScope,local_28.errorCode);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,RemoveError,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::remove()
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ret = QFileSystemEngine::removeFile(d->fileEntry, error);
    if (!ret)
        setError(QFile::RemoveError, error.toString());
    else
        d->metaData.clear();
    return ret;
}